

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ushort uVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_short> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<unsigned_short> *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  ImDrawIdx IVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar14 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  lVar17 = (long)(((pGVar8->Offset + prim) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  uVar4 = *(ushort *)((long)pGVar8->Xs + lVar17);
  dVar22 = log10((double)*(ushort *)((long)pGVar8->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar15 = GImPlot;
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar14->CurrentPlot;
  dVar2 = pIVar10->YAxis[iVar5].Range.Min;
  fVar23 = (float)(((double)uVar4 - (pIVar10->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar19 = (float)((((double)(float)(dVar22 / pIVar14->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar14->My[iVar5] + (double)pIVar14->PixelRange[iVar5].Min.y);
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar11->Count;
  uVar4 = *(ushort *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar11->Stride);
  dVar22 = log10(pGVar11->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  pIVar10 = pIVar15->CurrentPlot;
  dVar2 = pIVar10->YAxis[iVar5].Range.Min;
  fVar24 = (float)(((double)uVar4 - (pIVar10->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar5].Min.x);
  fVar25 = (float)((((double)(float)(dVar22 / pIVar15->LogDenY[iVar5]) *
                     (pIVar10->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar15->My[iVar5] + (double)pIVar15->PixelRange[iVar5].Min.y);
  fVar20 = fVar19;
  if (fVar25 <= fVar19) {
    fVar20 = fVar25;
  }
  bVar18 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar25 <= fVar19) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar23;
    if (fVar24 <= fVar23) {
      fVar20 = fVar24;
    }
    bVar18 = false;
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar23) & (uint)fVar23);
      bVar18 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar18 != false) {
    fVar20 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar26 = fVar24 - fVar23;
    fVar27 = fVar25 - fVar19;
    fVar21 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar26 = fVar26 * (1.0 / fVar21);
      fVar27 = fVar27 * (1.0 / fVar21);
    }
    fVar20 = fVar20 * 0.5;
    fVar26 = fVar26 * fVar20;
    fVar20 = fVar20 * fVar27;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar20 + fVar23;
    (pIVar12->pos).y = fVar19 - fVar26;
    pIVar12->uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar20 + fVar24;
    pIVar12[1].pos.y = fVar25 - fVar26;
    pIVar12[1].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar24 - fVar20;
    pIVar12[2].pos.y = fVar26 + fVar25;
    pIVar12[2].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar23 - fVar20;
    pIVar12[3].pos.y = fVar26 + fVar19;
    pIVar12[3].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar16;
    pIVar13[1] = IVar16 + 1;
    pIVar13[2] = IVar16 + 2;
    pIVar13[3] = IVar16;
    pIVar13[4] = IVar16 + 2;
    pIVar13[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }